

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Vector<float,_2>_> __thiscall
deqp::gls::BuiltinPrecisionTests::ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
          (ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *this,int i)

{
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  ExprP<tcu::Vector<float,_2>_> EVar1;
  ExprP<tcu::Matrix<float,_2,_2>_> local_30;
  int local_1c;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_> *pSStack_18;
  int i_local;
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *this_local;
  
  pSStack_18 = (SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>
                *)CONCAT44(in_register_00000034,i);
  local_1c = in_EDX;
  this_local = this;
  exprP<tcu::Matrix<float,2,2>>((BuiltinPrecisionTests *)&local_30,pSStack_18);
  Functions::getComponent<tcu::Matrix<float,2,2>>((Functions *)this,&local_30,local_1c);
  ExprP<tcu::Matrix<float,_2,_2>_>::~ExprP(&local_30);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state =
       extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_2>_> *)this;
  return (ExprP<tcu::Vector<float,_2>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>;
}

Assistant:

ExprP<typename T::Element> ContainerExprPBase<T>::operator[] (int i) const
{
	return Functions::getComponent(exprP<T>(*this), i);
}